

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2.c
# Opt level: O1

size_t argon2_memory_size(uint32_t m_cost,uint32_t parallelism)

{
  ulong uVar1;
  
  uVar1 = (ulong)(parallelism * 8);
  if (parallelism * 8 <= m_cost) {
    uVar1 = (ulong)m_cost;
  }
  return (ulong)(uint)(((int)uVar1 - (int)(uVar1 % (ulong)(parallelism << 2))) * 0x400);
}

Assistant:

static void argon2_compute_memory_blocks(uint32_t *memory_blocks,
                                         uint32_t *segment_length,
                                         uint32_t m_cost, uint32_t lanes)
{
    /* Minimum memory_blocks = 8L blocks, where L is the number of lanes */
    *memory_blocks = m_cost;
    if (*memory_blocks < 2 * ARGON2_SYNC_POINTS * lanes) {
        *memory_blocks = 2 * ARGON2_SYNC_POINTS * lanes;
    }

    *segment_length = *memory_blocks / (lanes * ARGON2_SYNC_POINTS);
    /* Ensure that all segments have equal length */
    *memory_blocks = *segment_length * (lanes * ARGON2_SYNC_POINTS);
}